

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nacm.c
# Opt level: O2

int nacm_position(void *parent,LYEXT_PAR parent_type,LYEXT_SUBSTMT UNUSED_substmt_type)

{
  uint uVar1;
  
  if (parent_type == LYEXT_PAR_NODE) {
    uVar1 = (uint)((*(ushort *)((long)parent + 0x38) & 0xf1ff) == 0);
  }
  else {
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

int nacm_position(const void *parent, LYEXT_PAR parent_type, LYEXT_SUBSTMT UNUSED(substmt_type))
{
    if (parent_type != LYEXT_PAR_NODE) {
        return 1;
    }

    if (((struct lys_node*)parent)->nodetype &
            (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CHOICE | LYS_ANYDATA | LYS_AUGMENT | LYS_CASE |
             LYS_USES | LYS_RPC | LYS_ACTION | LYS_NOTIF )) {
        return 0;
    } else {
        return 1;
    }
}